

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::ThreadPool::worker::operator()(worker *this)

{
  condition_variable *pcVar1;
  _List_node_base *p_Var2;
  ThreadPool *pTVar3;
  byte bVar4;
  unique_lock<std::mutex> lock;
  function<void_()> fn;
  unique_lock<std::mutex> local_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  do {
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_58._M_device = &this->pool_->mutex_;
    local_58._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    pTVar3 = this->pool_;
    if ((pTVar3->jobs_).
        super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)&pTVar3->jobs_) {
      pcVar1 = &pTVar3->cond_;
      do {
        if (pTVar3->shutdown_ != false) break;
        std::condition_variable::wait((unique_lock *)pcVar1);
        pTVar3 = this->pool_;
      } while ((pTVar3->jobs_).
               super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&pTVar3->jobs_);
    }
    p_Var2 = (pTVar3->jobs_).
             super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    bVar4 = p_Var2 == (_List_node_base *)&pTVar3->jobs_ & pTVar3->shutdown_;
    if (bVar4 == 0) {
      std::function<void_()>::operator=
                ((function<void_()> *)&local_48,(function<void_()> *)(p_Var2 + 1));
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_M_erase
                (&this->pool_->jobs_,
                 (this->pool_->jobs_).
                 super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next);
      std::unique_lock<std::mutex>::~unique_lock(&local_58);
      if (local_38 == (code *)0x0) {
        __assert_fail("true == static_cast<bool>(fn)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h"
                      ,0x1c1,"void httplib::ThreadPool::worker::operator()()");
      }
      (*pcStack_30)(&local_48);
    }
    else {
      std::unique_lock<std::mutex>::~unique_lock(&local_58);
    }
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (bVar4 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void operator()() {
      for (;;) {
        std::function<void()> fn;
        {
          std::unique_lock<std::mutex> lock(pool_.mutex_);

          pool_.cond_.wait(
              lock, [&] { return !pool_.jobs_.empty() || pool_.shutdown_; });

          if (pool_.shutdown_ && pool_.jobs_.empty()) { break; }

          fn = pool_.jobs_.front();
          pool_.jobs_.pop_front();
        }

        assert(true == static_cast<bool>(fn));
        fn();
      }
    }